

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

char * make_name(char *fmt,...)

{
  char in_AL;
  uint uVar1;
  char *__dest;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [256];
  undefined8 local_1d8;
  void **local_1d0;
  undefined1 *local_1c8;
  undefined1 local_1b8 [8];
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  char local_108 [256];
  
  local_1c8 = local_1b8;
  if (in_AL != '\0') {
    local_188 = in_XMM0_Qa;
    local_178 = in_XMM1_Qa;
    local_168 = in_XMM2_Qa;
    local_158 = in_XMM3_Qa;
    local_148 = in_XMM4_Qa;
    local_138 = in_XMM5_Qa;
    local_128 = in_XMM6_Qa;
    local_118 = in_XMM7_Qa;
  }
  local_1d0 = &ap[0].overflow_arg_area;
  local_1d8 = 0x3000000008;
  local_1b0 = in_RSI;
  local_1a8 = in_RDX;
  local_1a0 = in_RCX;
  local_198 = in_R8;
  local_190 = in_R9;
  uVar1 = vsnprintf(local_108,0x100,fmt,&local_1d8);
  if (uVar1 < 0x100) {
    __dest = (char *)malloc((ulong)(uVar1 + 1));
    strcpy(__dest,local_108);
    return __dest;
  }
  __assert_fail("n < 256 && n >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                ,0xdd,"char *make_name(char *, ...)");
}

Assistant:

static char *make_name(char *fmt, ...) {
  int n;
  char *h_buf, buf[256];
  va_list ap;
  va_start(ap, fmt);
  n = vsnprintf(buf, sizeof(buf), fmt, ap);
  va_end(ap);
  assert(n < 256 && n >= 0);
  h_buf = MALLOC(n + 1);
  strcpy(h_buf, buf);
  return h_buf;
}